

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O3

void test_boundary_insertion<Gudhi::persistence_matrix::Matrix<Boundary_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true>>>
               (void)

{
  Index *pIVar1;
  uint uVar2;
  pointer puVar3;
  _Hash_node_base *p_Var4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  pointer pvVar25;
  int iVar26;
  pointer p_4;
  pointer p;
  _Hash_node_base *p_Var27;
  Index IVar28;
  ulong uVar29;
  _Hash_node_base *p_Var30;
  undefined4 local_7e8;
  int local_7e4;
  undefined1 *local_7e0;
  undefined **local_7d8;
  undefined **local_7d0;
  ulong local_7c8;
  shared_count sStack_7c0;
  undefined1 **local_7b8;
  undefined **local_7b0;
  char *local_7a8;
  undefined8 *local_7a0;
  char *local_798;
  undefined **local_790;
  undefined1 local_788;
  undefined8 *local_780;
  undefined ***local_778;
  undefined1 local_770 [8];
  undefined8 local_768;
  shared_count sStack_760;
  char *local_758;
  char *local_750;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  orderedBoundaries;
  value_type boundary1;
  value_type boundary2;
  Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_> m;
  char *local_540;
  char *local_538;
  undefined1 *local_530;
  undefined1 *local_528;
  char *local_520;
  char *local_518;
  undefined1 *local_510;
  undefined1 *local_508;
  char *local_500;
  char *local_4f8;
  undefined1 *local_4f0;
  undefined1 *local_4e8;
  char *local_4e0;
  char *local_4d8;
  undefined1 *local_4d0;
  undefined1 *local_4c8;
  char *local_4c0;
  char *local_4b8;
  undefined1 *local_4b0;
  undefined1 *local_4a8;
  char *local_4a0;
  char *local_498;
  undefined1 *local_490;
  undefined1 *local_488;
  char *local_480;
  char *local_478;
  undefined1 *local_470;
  undefined1 *local_468;
  char *local_460;
  char *local_458;
  undefined1 *local_450;
  undefined1 *local_448;
  char *local_440;
  char *local_438;
  undefined1 *local_430;
  undefined1 *local_428;
  char *local_420;
  char *local_418;
  undefined1 *local_410;
  undefined1 *local_408;
  char *local_400;
  char *local_3f8;
  undefined1 *local_3f0;
  undefined1 *local_3e8;
  char *local_3e0;
  char *local_3d8;
  undefined1 *local_3d0;
  undefined1 *local_3c8;
  char *local_3c0;
  char *local_3b8;
  undefined1 *local_3b0;
  undefined1 *local_3a8;
  char *local_3a0;
  char *local_398;
  char *local_390;
  char *local_388;
  undefined1 *local_380;
  undefined1 *local_378;
  char *local_370;
  char *local_368;
  char *local_360;
  char *local_358;
  undefined1 *local_350;
  undefined1 *local_348;
  char *local_340;
  char *local_338;
  char *local_330;
  char *local_328;
  undefined1 *local_320;
  undefined1 *local_318;
  char *local_310;
  char *local_308;
  char *local_300;
  char *local_2f8;
  undefined1 *local_2f0;
  undefined1 *local_2e8;
  char *local_2e0;
  char *local_2d8;
  char *local_2d0;
  char *local_2c8;
  undefined1 *local_2c0;
  undefined1 *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  char *local_298;
  undefined1 *local_290;
  undefined1 *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  char *local_268;
  undefined1 *local_260;
  undefined1 *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  undefined1 *local_230;
  undefined1 *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  char *local_208;
  undefined1 *local_200;
  undefined1 *local_1f8;
  char *local_1f0;
  char *local_1e8;
  undefined1 *local_1e0;
  undefined1 *local_1d8;
  char *local_1d0;
  char *local_1c8;
  undefined1 *local_1c0;
  undefined1 *local_1b8;
  char *local_1b0;
  char *local_1a8;
  undefined1 *local_1a0;
  undefined1 *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  char *local_178;
  undefined1 *local_170;
  undefined1 *local_168;
  char *local_160;
  char *local_158;
  char *local_150;
  char *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  char *local_130;
  char *local_128;
  char *local_120;
  char *local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  build_simple_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true>>>>
            ();
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&boundary2,
             orderedBoundaries.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1);
  puVar3 = orderedBoundaries.
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1].
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pvVar25 = orderedBoundaries.
            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish + -1;
  if (puVar3 != (pointer)0x0) {
    pvVar25 = orderedBoundaries.
              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish + -1;
    orderedBoundaries.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         orderedBoundaries.
         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + -1;
    operator_delete(puVar3,(long)(pvVar25->
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar3);
    pvVar25 = orderedBoundaries.
              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  }
  orderedBoundaries.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pvVar25;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&boundary1,
             orderedBoundaries.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1);
  puVar3 = orderedBoundaries.
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1].
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pvVar25 = orderedBoundaries.
            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish + -1;
  if (puVar3 != (pointer)0x0) {
    pvVar25 = orderedBoundaries.
              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish + -1;
    orderedBoundaries.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         orderedBoundaries.
         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + -1;
    operator_delete(puVar3,(long)(pvVar25->
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar3);
    pvVar25 = orderedBoundaries.
              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  }
  orderedBoundaries.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pvVar25;
  m.colSettings_ = (Column_settings *)operator_new(0x38);
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.
  super_simple_segregated_storage<unsigned_long>.first = (void *)0x0;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.list.ptr = (char *)0x0;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.list.sz = 0;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.requested_size = 0x18;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.next_size = 0x20;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.start_size = 0x20;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.max_size = 0;
  Gudhi::persistence_matrix::
  Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true>>>
  ::Boundary_matrix<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true>>>
              *)&m.matrix_,&orderedBoundaries,m.colSettings_);
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x1ba);
  if (m.matrix_.matrix_._M_h._M_buckets[m.matrix_.matrix_._M_h._M_bucket_count != 1] !=
      (__node_base_ptr)0x0) {
    p_Var30 = m.matrix_.matrix_._M_h._M_buckets[m.matrix_.matrix_._M_h._M_bucket_count != 1]->_M_nxt
    ;
    uVar2 = *(uint *)&p_Var30[1]._M_nxt;
    while (uVar2 != 1) {
      p_Var30 = p_Var30->_M_nxt;
      if ((p_Var30 == (_Hash_node_base *)0x0) ||
         (uVar2 = *(uint *)&p_Var30[1]._M_nxt,
         (uint)((ulong)uVar2 % m.matrix_.matrix_._M_h._M_bucket_count) !=
         (uint)(m.matrix_.matrix_._M_h._M_bucket_count != 1))) goto LAB_0011e764;
    }
    if (*m.matrix_.
         super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<true,_(Column_types)7,_true,_true,_true>_>_>_>
         .indexToRow_._M_h._M_buckets != (__node_base_ptr)0x0) {
      p_Var4 = (*m.matrix_.
                 super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<true,_(Column_types)7,_true,_true,_true>_>_>_>
                 .indexToRow_._M_h._M_buckets)->_M_nxt;
      uVar2 = *(uint *)&p_Var4[1]._M_nxt;
      goto joined_r0x0011b88f;
    }
  }
  goto LAB_0011e764;
  while( true ) {
    if (p_Var27 == (_Hash_node_base *)0x0) goto LAB_0011e8d2;
    if (*(int *)&p_Var27[2]._M_nxt == *(int *)((long)&p_Var4[1]._M_nxt + 4)) break;
LAB_0011b8c7:
    p_Var27 = p_Var27->_M_nxt;
    if (p_Var27 == p_Var30) break;
  }
  local_7d0 = (undefined **)CONCAT71(local_7d0._1_7_,p_Var27 == p_Var30);
  local_7c8 = 0;
  sStack_7c0.pi_ = (sp_counted_base *)0x0;
  local_7b0 = (undefined **)0x1b6b44;
  local_7a8 = "";
  local_788 = 0;
  local_790 = &PTR__lazy_ostream_001f2250;
  local_780 = &boost::unit_test::lazy_ostream::inst;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_58 = "";
  local_778 = &local_7b0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_7c0);
  local_70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_68 = "";
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_70,0x1bb);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = m.matrix_.matrix_._M_h._M_bucket_count;
  uVar29 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar5,0);
  if (m.matrix_.matrix_._M_h._M_buckets[uVar29 & 0xffffffff] != (__node_base_ptr)0x0) {
    p_Var30 = m.matrix_.matrix_._M_h._M_buckets[uVar29 & 0xffffffff]->_M_nxt;
    uVar2 = *(uint *)&p_Var30[1]._M_nxt;
    while (uVar2 != 3) {
      p_Var30 = p_Var30->_M_nxt;
      if ((p_Var30 == (_Hash_node_base *)0x0) ||
         (uVar2 = *(uint *)&p_Var30[1]._M_nxt,
         (ulong)uVar2 % m.matrix_.matrix_._M_h._M_bucket_count != uVar29)) goto LAB_0011e770;
    }
    if (*m.matrix_.
         super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<true,_(Column_types)7,_true,_true,_true>_>_>_>
         .indexToRow_._M_h._M_buckets != (__node_base_ptr)0x0) {
      p_Var4 = (*m.matrix_.
                 super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<true,_(Column_types)7,_true,_true,_true>_>_>_>
                 .indexToRow_._M_h._M_buckets)->_M_nxt;
      uVar2 = *(uint *)&p_Var4[1]._M_nxt;
      goto joined_r0x0011ba15;
    }
  }
  goto LAB_0011e770;
joined_r0x0011c62b:
  if (uVar2 == 1) {
    if (*m.matrix_.
         super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<true,_(Column_types)7,_true,_true,_true>_>_>_>
         .indexToRow_._M_h._M_buckets != (__node_base_ptr)0x0) {
      p_Var4 = (*m.matrix_.
                 super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<true,_(Column_types)7,_true,_true,_true>_>_>_>
                 .indexToRow_._M_h._M_buckets)->_M_nxt;
      uVar2 = *(uint *)&p_Var4[1]._M_nxt;
      goto joined_r0x0011c66d;
    }
    goto LAB_0011e77c;
  }
  p_Var30 = p_Var30->_M_nxt;
  if ((p_Var30 == (_Hash_node_base *)0x0) ||
     (uVar2 = *(uint *)&p_Var30[1]._M_nxt,
     (uint)((ulong)uVar2 % m.matrix_.matrix_._M_h._M_bucket_count) !=
     (uint)(m.matrix_.matrix_._M_h._M_bucket_count != 1))) goto LAB_0011e77c;
  goto joined_r0x0011c62b;
joined_r0x0011c66d:
  if (uVar2 == 0) {
    p_Var30 = p_Var30 + 5;
    p_Var27 = p_Var30;
    goto LAB_0011c6a5;
  }
  p_Var4 = p_Var4->_M_nxt;
  if ((p_Var4 == (_Hash_node_base *)0x0) ||
     (uVar2 = *(uint *)&p_Var4[1]._M_nxt,
     (ulong)uVar2 %
     m.matrix_.
     super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<true,_(Column_types)7,_true,_true,_true>_>_>_>
     .indexToRow_._M_h._M_bucket_count != 0)) {
LAB_0011e77c:
    std::__throw_out_of_range("_Map_base::at");
  }
  goto joined_r0x0011c66d;
  while( true ) {
    if (p_Var27 == (_Hash_node_base *)0x0) goto LAB_0011e8d2;
    if (*(int *)&p_Var27[2]._M_nxt == *(int *)((long)&p_Var4[1]._M_nxt + 4)) break;
LAB_0011c6a5:
    p_Var27 = p_Var27->_M_nxt;
    if (p_Var27 == p_Var30) break;
  }
  local_7d0 = (undefined **)CONCAT71(local_7d0._1_7_,p_Var27 == p_Var30);
  local_7c8 = 0;
  sStack_7c0.pi_ = (sp_counted_base *)0x0;
  local_7b0 = (undefined **)0x1b6b44;
  local_7a8 = "";
  local_788 = 0;
  local_790 = &PTR__lazy_ostream_001f2250;
  local_780 = &boost::unit_test::lazy_ostream::inst;
  local_210 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_208 = "";
  local_778 = &local_7b0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_7c0);
  local_220 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_218 = "";
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_220,0x1c8);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = m.matrix_.matrix_._M_h._M_bucket_count;
  uVar29 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar9,0);
  if (m.matrix_.matrix_._M_h._M_buckets[uVar29 & 0xffffffff] != (__node_base_ptr)0x0) {
    p_Var30 = m.matrix_.matrix_._M_h._M_buckets[uVar29 & 0xffffffff]->_M_nxt;
    uVar2 = *(uint *)&p_Var30[1]._M_nxt;
    while (uVar2 != 3) {
      p_Var30 = p_Var30->_M_nxt;
      if ((p_Var30 == (_Hash_node_base *)0x0) ||
         (uVar2 = *(uint *)&p_Var30[1]._M_nxt,
         (ulong)uVar2 % m.matrix_.matrix_._M_h._M_bucket_count != uVar29)) goto LAB_0011e788;
    }
    if (*m.matrix_.
         super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<true,_(Column_types)7,_true,_true,_true>_>_>_>
         .indexToRow_._M_h._M_buckets != (__node_base_ptr)0x0) {
      p_Var4 = (*m.matrix_.
                 super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<true,_(Column_types)7,_true,_true,_true>_>_>_>
                 .indexToRow_._M_h._M_buckets)->_M_nxt;
      uVar2 = *(uint *)&p_Var4[1]._M_nxt;
      goto joined_r0x0011c7e3;
    }
  }
  goto LAB_0011e788;
  while( true ) {
    if (p_Var27 == (_Hash_node_base *)0x0) goto LAB_0011e8d2;
    if (*(int *)&p_Var27[2]._M_nxt == *(int *)((long)&p_Var4[1]._M_nxt + 4)) break;
LAB_0011ba4d:
    p_Var27 = p_Var27->_M_nxt;
    if (p_Var27 == p_Var30) break;
  }
  local_7c8 = 0;
  sStack_7c0.pi_ = (sp_counted_base *)0x0;
  local_7b0 = (undefined **)0x1b6b5a;
  local_7a8 = "";
  local_788 = 0;
  local_790 = &PTR__lazy_ostream_001f2250;
  local_780 = &boost::unit_test::lazy_ostream::inst;
  local_90 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_88 = "";
  local_778 = &local_7b0;
  local_7d0._0_1_ = p_Var27 != p_Var30;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_7c0);
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_98 = "";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0x1bc);
  if (*m.matrix_.matrix_._M_h._M_buckets == (__node_base_ptr)0x0) {
LAB_0011e794:
    std::__throw_out_of_range("_Map_base::at");
  }
  p_Var30 = (*m.matrix_.matrix_._M_h._M_buckets)->_M_nxt;
  uVar2 = *(uint *)&p_Var30[1]._M_nxt;
  while (uVar2 != 0) {
    p_Var30 = p_Var30->_M_nxt;
    if ((p_Var30 == (_Hash_node_base *)0x0) ||
       (uVar2 = *(uint *)&p_Var30[1]._M_nxt,
       (ulong)uVar2 % m.matrix_.matrix_._M_h._M_bucket_count != 0)) goto LAB_0011e794;
  }
  local_7d0._0_1_ = p_Var30[5]._M_nxt == p_Var30 + 5 || p_Var30[5]._M_nxt == (_Hash_node_base *)0x0;
  local_7c8 = 0;
  sStack_7c0.pi_ = (sp_counted_base *)0x0;
  local_7b0 = (undefined **)0x1b6b71;
  local_7a8 = "";
  local_788 = 0;
  local_790 = &PTR__lazy_ostream_001f2250;
  local_780 = &boost::unit_test::lazy_ostream::inst;
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_b8 = "";
  local_778 = &local_7b0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_7c0);
  local_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_c8 = "";
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_d0,0x1bd);
  if (m.matrix_.matrix_._M_h._M_buckets[m.matrix_.matrix_._M_h._M_bucket_count != 1] ==
      (__node_base_ptr)0x0) goto LAB_0011e7c4;
  p_Var30 = m.matrix_.matrix_._M_h._M_buckets[m.matrix_.matrix_._M_h._M_bucket_count != 1]->_M_nxt;
  uVar2 = *(uint *)&p_Var30[1]._M_nxt;
  while (uVar2 != 1) {
    p_Var30 = p_Var30->_M_nxt;
    if ((p_Var30 == (_Hash_node_base *)0x0) ||
       (uVar2 = *(uint *)&p_Var30[1]._M_nxt,
       (uint)((ulong)uVar2 % m.matrix_.matrix_._M_h._M_bucket_count) !=
       (uint)(m.matrix_.matrix_._M_h._M_bucket_count != 1))) {
LAB_0011e7c4:
      std::__throw_out_of_range("_Map_base::at");
    }
  }
  local_7d0._0_1_ = p_Var30[5]._M_nxt == p_Var30 + 5 || p_Var30[5]._M_nxt == (_Hash_node_base *)0x0;
  local_7c8 = 0;
  sStack_7c0.pi_ = (sp_counted_base *)0x0;
  local_7b0 = (undefined **)0x1b6b85;
  local_7a8 = "";
  local_788 = 0;
  local_790 = &PTR__lazy_ostream_001f2250;
  local_780 = &boost::unit_test::lazy_ostream::inst;
  local_f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_e8 = "";
  local_778 = &local_7b0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_7c0);
  local_100 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_f8 = "";
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_100,0x1be);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = m.matrix_.matrix_._M_h._M_bucket_count;
  uVar29 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(2)) % auVar6,0);
  if (m.matrix_.matrix_._M_h._M_buckets[uVar29 & 0xffffffff] == (__node_base_ptr)0x0) {
LAB_0011e7d0:
    std::__throw_out_of_range("_Map_base::at");
  }
  p_Var30 = m.matrix_.matrix_._M_h._M_buckets[uVar29 & 0xffffffff]->_M_nxt;
  uVar2 = *(uint *)&p_Var30[1]._M_nxt;
  while (uVar2 != 2) {
    p_Var30 = p_Var30->_M_nxt;
    if ((p_Var30 == (_Hash_node_base *)0x0) ||
       (uVar2 = *(uint *)&p_Var30[1]._M_nxt,
       (ulong)uVar2 % m.matrix_.matrix_._M_h._M_bucket_count != uVar29)) goto LAB_0011e7d0;
  }
  local_7d0._0_1_ = p_Var30[5]._M_nxt == p_Var30 + 5 || p_Var30[5]._M_nxt == (_Hash_node_base *)0x0;
  local_7c8 = 0;
  sStack_7c0.pi_ = (sp_counted_base *)0x0;
  local_7b0 = (undefined **)0x1b6b99;
  local_7a8 = "";
  local_788 = 0;
  local_790 = &PTR__lazy_ostream_001f2250;
  local_780 = &boost::unit_test::lazy_ostream::inst;
  local_120 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_118 = "";
  local_778 = &local_7b0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_7c0);
  local_130 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_128 = "";
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_130,0x1bf);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = m.matrix_.matrix_._M_h._M_bucket_count;
  uVar29 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar7,0);
  if (m.matrix_.matrix_._M_h._M_buckets[uVar29 & 0xffffffff] == (__node_base_ptr)0x0)
  goto LAB_0011e7dc;
  p_Var30 = m.matrix_.matrix_._M_h._M_buckets[uVar29 & 0xffffffff]->_M_nxt;
  uVar2 = *(uint *)&p_Var30[1]._M_nxt;
  while (uVar2 != 3) {
    p_Var30 = p_Var30->_M_nxt;
    if ((p_Var30 == (_Hash_node_base *)0x0) ||
       (uVar2 = *(uint *)&p_Var30[1]._M_nxt,
       (ulong)uVar2 % m.matrix_.matrix_._M_h._M_bucket_count != uVar29)) {
LAB_0011e7dc:
      std::__throw_out_of_range("_Map_base::at");
    }
  }
  local_7d0._0_1_ = p_Var30[5]._M_nxt != p_Var30 + 5 && p_Var30[5]._M_nxt != (_Hash_node_base *)0x0;
  local_7c8 = 0;
  sStack_7c0.pi_ = (sp_counted_base *)0x0;
  local_7b0 = (undefined **)0x1b6bad;
  local_7a8 = "";
  local_788 = 0;
  local_790 = &PTR__lazy_ostream_001f2250;
  local_780 = &boost::unit_test::lazy_ostream::inst;
  local_150 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_148 = "";
  local_778 = &local_7b0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_7c0);
  local_160 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_158 = "";
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_160,0x1c0);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = m.matrix_.matrix_._M_h._M_bucket_count;
  uVar29 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(4)) % auVar8,0);
  if (m.matrix_.matrix_._M_h._M_buckets[uVar29 & 0xffffffff] != (__node_base_ptr)0x0) {
    p_Var30 = m.matrix_.matrix_._M_h._M_buckets[uVar29 & 0xffffffff]->_M_nxt;
    uVar2 = *(uint *)&p_Var30[1]._M_nxt;
    do {
      if (uVar2 == 4) {
        local_7d0 = (undefined **)
                    CONCAT71(local_7d0._1_7_,
                             p_Var30[5]._M_nxt != p_Var30 + 5 &&
                             p_Var30[5]._M_nxt != (_Hash_node_base *)0x0);
        local_7c8 = 0;
        sStack_7c0.pi_ = (sp_counted_base *)0x0;
        local_7b0 = (undefined **)0x1b6bc2;
        local_7a8 = "";
        local_788 = 0;
        local_790 = &PTR__lazy_ostream_001f2250;
        local_780 = &boost::unit_test::lazy_ostream::inst;
        local_180 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
        ;
        local_178 = "";
        local_778 = &local_7b0;
        boost::test_tools::tt_detail::report_assertion(&local_7d0,&local_790,&local_180,0x1c0,1,0,0)
        ;
        boost::detail::shared_count::~shared_count(&sStack_7c0);
        local_190 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
        ;
        local_188 = "";
        local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
        local_198 = &boost::unit_test::basic_cstring<char_const>::null;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_190,0x1c2);
        local_7a8 = (char *)((ulong)local_7a8 & 0xffffffffffffff00);
        local_7b0 = &PTR__lazy_ostream_001f2110;
        local_7a0 = &boost::unit_test::lazy_ostream::inst;
        local_798 = "";
        local_7d8 = (undefined **)&local_7e4;
        local_7e4 = (int)m.matrix_.matrix_._M_h._M_element_count;
        local_770[0] = (int)m.matrix_.matrix_._M_h._M_element_count == 5;
        local_7e8 = 5;
        local_768 = 0;
        sStack_760.pi_ = (sp_counted_base *)0x0;
        local_758 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
        ;
        local_750 = "";
        local_778 = &local_7d8;
        local_788 = 0;
        local_790 = &PTR__lazy_ostream_001f2080;
        local_780 = &boost::unit_test::lazy_ostream::inst;
        local_7b8 = &local_7e0;
        local_7c8 = local_7c8 & 0xffffffffffffff00;
        local_7d0 = &PTR__lazy_ostream_001f20d0;
        sStack_7c0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
        local_7e0 = (undefined1 *)&local_7e8;
        boost::test_tools::tt_detail::report_assertion();
        boost::detail::shared_count::~shared_count(&sStack_760);
        local_790 = (undefined **)CONCAT44(local_790._4_4_,m.matrix_.nextInsertIndex_);
        iVar26 = (int)((ulong)((long)boundary1.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)boundary1.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start) >> 2) + -1;
        if (boundary1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            boundary1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start) {
          iVar26 = 0;
        }
        if (m.matrix_.
            super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<true,_(Column_types)7,_true,_true,_true>_>_>_>
            .rowSwapped_ == true) {
          Gudhi::persistence_matrix::
          Base_swap<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>,_Gudhi::persistence_matrix::Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>
          ::_orderRows(&m.matrix_.
                        super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<true,_(Column_types)7,_true,_true,_true>_>_>_>
                      );
        }
        std::
        _Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        ::_M_emplace<unsigned_int&,unsigned_int&>
                  ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    *)&m.matrix_.
                       super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<true,_(Column_types)7,_true,_true,_true>_>_>_>
                   ,&local_790);
        std::
        _Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        ::_M_emplace<unsigned_int&,unsigned_int&>
                  ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    *)&m.matrix_.
                       super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<true,_(Column_types)7,_true,_true,_true>_>_>_>
                       .rowToIndex_,&local_790,&local_790);
        pIVar1 = &m.matrix_.nextInsertIndex_;
        IVar28 = (Index)local_790;
        if ((Index)local_790 != m.matrix_.nextInsertIndex_) {
          std::
          _Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::_M_emplace<unsigned_int&,unsigned_int&>
                    ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)&m.matrix_.super_Base_pairing_option.idToPosition_,&local_790,pIVar1);
          std::
          _Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::_M_emplace<unsigned_int&,unsigned_int&>
                    ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)&m.matrix_.super_Base_pairing_option,pIVar1,&local_790);
          IVar28 = m.matrix_.nextInsertIndex_;
        }
        Gudhi::persistence_matrix::
        Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true>>>
        ::_container_insert<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                  ((Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true>>>
                    *)&m.matrix_,&boundary1,IVar28,iVar26);
        m.matrix_.nextInsertIndex_ = m.matrix_.nextInsertIndex_ + 1;
        local_1b0 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
        ;
        local_1a8 = "";
        local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
        local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1b0,0x1c4);
        local_7a8 = (char *)((ulong)local_7a8 & 0xffffffffffffff00);
        local_7b0 = &PTR__lazy_ostream_001f2110;
        local_7a0 = &boost::unit_test::lazy_ostream::inst;
        local_798 = "";
        local_7e4 = (int)m.matrix_.matrix_._M_h._M_element_count;
        local_770[0] = (int)m.matrix_.matrix_._M_h._M_element_count == 6;
        local_7e8 = 6;
        local_768 = 0;
        sStack_760.pi_ = (sp_counted_base *)0x0;
        local_758 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
        ;
        local_750 = "";
        local_7d8 = (undefined **)&local_7e4;
        local_788 = 0;
        local_790 = &PTR__lazy_ostream_001f2080;
        local_780 = &boost::unit_test::lazy_ostream::inst;
        local_778 = &local_7d8;
        local_7c8 = local_7c8 & 0xffffffffffffff00;
        local_7d0 = &PTR__lazy_ostream_001f20d0;
        sStack_7c0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
        local_7b8 = &local_7e0;
        local_7e0 = (undefined1 *)&local_7e8;
        boost::test_tools::tt_detail::report_assertion();
        boost::detail::shared_count::~shared_count(&sStack_760);
        local_790 = (undefined **)CONCAT44(local_790._4_4_,m.matrix_.nextInsertIndex_);
        iVar26 = (int)((ulong)((long)boundary2.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)boundary2.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start) >> 2) + -1;
        if (boundary2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            boundary2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start) {
          iVar26 = 0;
        }
        if (m.matrix_.
            super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<true,_(Column_types)7,_true,_true,_true>_>_>_>
            .rowSwapped_ == true) {
          Gudhi::persistence_matrix::
          Base_swap<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>,_Gudhi::persistence_matrix::Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>
          ::_orderRows(&m.matrix_.
                        super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<true,_(Column_types)7,_true,_true,_true>_>_>_>
                      );
        }
        std::
        _Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        ::_M_emplace<unsigned_int&,unsigned_int&>
                  ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    *)&m.matrix_.
                       super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<true,_(Column_types)7,_true,_true,_true>_>_>_>
                   ,&local_790);
        std::
        _Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        ::_M_emplace<unsigned_int&,unsigned_int&>
                  ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    *)&m.matrix_.
                       super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<true,_(Column_types)7,_true,_true,_true>_>_>_>
                       .rowToIndex_,&local_790,&local_790);
        IVar28 = (Index)local_790;
        if ((Index)local_790 != m.matrix_.nextInsertIndex_) {
          std::
          _Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::_M_emplace<unsigned_int&,unsigned_int&>
                    ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)&m.matrix_.super_Base_pairing_option.idToPosition_,&local_790,pIVar1);
          std::
          _Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::_M_emplace<unsigned_int&,unsigned_int&>
                    ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)&m.matrix_.super_Base_pairing_option,pIVar1,&local_790);
          IVar28 = m.matrix_.nextInsertIndex_;
        }
        Gudhi::persistence_matrix::
        Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true>>>
        ::_container_insert<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                  ((Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true>>>
                    *)&m.matrix_,&boundary2,IVar28,iVar26);
        m.matrix_.nextInsertIndex_ = m.matrix_.nextInsertIndex_ + 1;
        local_1d0 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
        ;
        local_1c8 = "";
        local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
        local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1d0,0x1c6);
        local_7a8 = (char *)((ulong)local_7a8 & 0xffffffffffffff00);
        local_7b0 = &PTR__lazy_ostream_001f2110;
        local_7a0 = &boost::unit_test::lazy_ostream::inst;
        local_798 = "";
        local_7e4 = (int)m.matrix_.matrix_._M_h._M_element_count;
        local_770[0] = (int)m.matrix_.matrix_._M_h._M_element_count == 7;
        local_7e8 = 7;
        local_768 = 0;
        sStack_760.pi_ = (sp_counted_base *)0x0;
        local_758 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
        ;
        local_750 = "";
        local_7d8 = (undefined **)&local_7e4;
        local_788 = 0;
        local_790 = &PTR__lazy_ostream_001f2080;
        local_780 = &boost::unit_test::lazy_ostream::inst;
        local_778 = &local_7d8;
        local_7c8 = local_7c8 & 0xffffffffffffff00;
        local_7d0 = &PTR__lazy_ostream_001f20d0;
        sStack_7c0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
        local_7b8 = &local_7e0;
        local_7e0 = (undefined1 *)&local_7e8;
        boost::test_tools::tt_detail::report_assertion
                  (local_770,&local_7b0,&local_758,0x1c6,1,2,2,"m.get_number_of_columns()",
                   &local_790,"7",&local_7d0);
        boost::detail::shared_count::~shared_count(&sStack_760);
        local_1f0 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
        ;
        local_1e8 = "";
        local_200 = &boost::unit_test::basic_cstring<char_const>::null;
        local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1f0,0x1c7);
        if (m.matrix_.matrix_._M_h._M_buckets[m.matrix_.matrix_._M_h._M_bucket_count != 1] ==
            (__node_base_ptr)0x0) goto LAB_0011e77c;
        p_Var30 = m.matrix_.matrix_._M_h._M_buckets[m.matrix_.matrix_._M_h._M_bucket_count != 1]->
                  _M_nxt;
        uVar2 = *(uint *)&p_Var30[1]._M_nxt;
        goto joined_r0x0011c62b;
      }
      p_Var30 = p_Var30->_M_nxt;
    } while ((p_Var30 != (_Hash_node_base *)0x0) &&
            (uVar2 = *(uint *)&p_Var30[1]._M_nxt,
            (ulong)uVar2 % m.matrix_.matrix_._M_h._M_bucket_count == uVar29));
  }
  std::__throw_out_of_range("_Map_base::at");
  while( true ) {
    if (p_Var27 == (_Hash_node_base *)0x0) goto LAB_0011e8d2;
    if (*(int *)&p_Var27[2]._M_nxt == *(int *)((long)&p_Var4[1]._M_nxt + 4)) break;
LAB_0011c81b:
    p_Var27 = p_Var27->_M_nxt;
    if (p_Var27 == p_Var30) break;
  }
  local_7c8 = 0;
  sStack_7c0.pi_ = (sp_counted_base *)0x0;
  local_7b0 = (undefined **)0x1b6b5a;
  local_7a8 = "";
  local_788 = 0;
  local_790 = &PTR__lazy_ostream_001f2250;
  local_780 = &boost::unit_test::lazy_ostream::inst;
  local_240 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_238 = "";
  local_778 = &local_7b0;
  local_7d0._0_1_ = p_Var27 != p_Var30;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_7c0);
  local_250 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_248 = "";
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_250,0x1c9);
  if (*m.matrix_.matrix_._M_h._M_buckets == (__node_base_ptr)0x0) {
LAB_0011e7a0:
    std::__throw_out_of_range("_Map_base::at");
  }
  p_Var30 = (*m.matrix_.matrix_._M_h._M_buckets)->_M_nxt;
  uVar2 = *(uint *)&p_Var30[1]._M_nxt;
  while (uVar2 != 0) {
    p_Var30 = p_Var30->_M_nxt;
    if ((p_Var30 == (_Hash_node_base *)0x0) ||
       (uVar2 = *(uint *)&p_Var30[1]._M_nxt,
       (ulong)uVar2 % m.matrix_.matrix_._M_h._M_bucket_count != 0)) goto LAB_0011e7a0;
  }
  local_7d0._0_1_ = p_Var30[5]._M_nxt == p_Var30 + 5 || p_Var30[5]._M_nxt == (_Hash_node_base *)0x0;
  local_7c8 = 0;
  sStack_7c0.pi_ = (sp_counted_base *)0x0;
  local_7b0 = (undefined **)0x1b6b71;
  local_7a8 = "";
  local_788 = 0;
  local_790 = &PTR__lazy_ostream_001f2250;
  local_780 = &boost::unit_test::lazy_ostream::inst;
  local_270 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_268 = "";
  local_778 = &local_7b0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_7c0);
  local_280 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_278 = "";
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_280,0x1ca);
  if (m.matrix_.matrix_._M_h._M_buckets[m.matrix_.matrix_._M_h._M_bucket_count != 1] ==
      (__node_base_ptr)0x0) goto LAB_0011e7f4;
  p_Var30 = m.matrix_.matrix_._M_h._M_buckets[m.matrix_.matrix_._M_h._M_bucket_count != 1]->_M_nxt;
  uVar2 = *(uint *)&p_Var30[1]._M_nxt;
  while (uVar2 != 1) {
    p_Var30 = p_Var30->_M_nxt;
    if ((p_Var30 == (_Hash_node_base *)0x0) ||
       (uVar2 = *(uint *)&p_Var30[1]._M_nxt,
       (uint)((ulong)uVar2 % m.matrix_.matrix_._M_h._M_bucket_count) !=
       (uint)(m.matrix_.matrix_._M_h._M_bucket_count != 1))) {
LAB_0011e7f4:
      std::__throw_out_of_range("_Map_base::at");
    }
  }
  local_7d0._0_1_ = p_Var30[5]._M_nxt == p_Var30 + 5 || p_Var30[5]._M_nxt == (_Hash_node_base *)0x0;
  local_7c8 = 0;
  sStack_7c0.pi_ = (sp_counted_base *)0x0;
  local_7b0 = (undefined **)0x1b6b85;
  local_7a8 = "";
  local_788 = 0;
  local_790 = &PTR__lazy_ostream_001f2250;
  local_780 = &boost::unit_test::lazy_ostream::inst;
  local_2a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_298 = "";
  local_778 = &local_7b0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_7c0);
  local_2b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2a8 = "";
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2b0,0x1cb);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = m.matrix_.matrix_._M_h._M_bucket_count;
  uVar29 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(2)) % auVar10,0);
  if (m.matrix_.matrix_._M_h._M_buckets[uVar29 & 0xffffffff] == (__node_base_ptr)0x0) {
LAB_0011e800:
    std::__throw_out_of_range("_Map_base::at");
  }
  p_Var30 = m.matrix_.matrix_._M_h._M_buckets[uVar29 & 0xffffffff]->_M_nxt;
  uVar2 = *(uint *)&p_Var30[1]._M_nxt;
  while (uVar2 != 2) {
    p_Var30 = p_Var30->_M_nxt;
    if ((p_Var30 == (_Hash_node_base *)0x0) ||
       (uVar2 = *(uint *)&p_Var30[1]._M_nxt,
       (ulong)uVar2 % m.matrix_.matrix_._M_h._M_bucket_count != uVar29)) goto LAB_0011e800;
  }
  local_7d0._0_1_ = p_Var30[5]._M_nxt == p_Var30 + 5 || p_Var30[5]._M_nxt == (_Hash_node_base *)0x0;
  local_7c8 = 0;
  sStack_7c0.pi_ = (sp_counted_base *)0x0;
  local_7b0 = (undefined **)0x1b6b99;
  local_7a8 = "";
  local_788 = 0;
  local_790 = &PTR__lazy_ostream_001f2250;
  local_780 = &boost::unit_test::lazy_ostream::inst;
  local_2d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2c8 = "";
  local_778 = &local_7b0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_7c0);
  local_2e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2d8 = "";
  local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2e0,0x1cc);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = m.matrix_.matrix_._M_h._M_bucket_count;
  uVar29 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar11,0);
  if (m.matrix_.matrix_._M_h._M_buckets[uVar29 & 0xffffffff] == (__node_base_ptr)0x0)
  goto LAB_0011e80c;
  p_Var30 = m.matrix_.matrix_._M_h._M_buckets[uVar29 & 0xffffffff]->_M_nxt;
  uVar2 = *(uint *)&p_Var30[1]._M_nxt;
  while (uVar2 != 3) {
    p_Var30 = p_Var30->_M_nxt;
    if ((p_Var30 == (_Hash_node_base *)0x0) ||
       (uVar2 = *(uint *)&p_Var30[1]._M_nxt,
       (ulong)uVar2 % m.matrix_.matrix_._M_h._M_bucket_count != uVar29)) {
LAB_0011e80c:
      std::__throw_out_of_range("_Map_base::at");
    }
  }
  local_7d0._0_1_ = p_Var30[5]._M_nxt != p_Var30 + 5 && p_Var30[5]._M_nxt != (_Hash_node_base *)0x0;
  local_7c8 = 0;
  sStack_7c0.pi_ = (sp_counted_base *)0x0;
  local_7b0 = (undefined **)0x1b6bad;
  local_7a8 = "";
  local_788 = 0;
  local_790 = &PTR__lazy_ostream_001f2250;
  local_780 = &boost::unit_test::lazy_ostream::inst;
  local_300 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2f8 = "";
  local_778 = &local_7b0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_7c0);
  local_310 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_308 = "";
  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
  local_318 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_310,0x1cd);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = m.matrix_.matrix_._M_h._M_bucket_count;
  uVar29 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(4)) % auVar12,0);
  if (m.matrix_.matrix_._M_h._M_buckets[uVar29 & 0xffffffff] == (__node_base_ptr)0x0) {
LAB_0011e818:
    std::__throw_out_of_range("_Map_base::at");
  }
  p_Var30 = m.matrix_.matrix_._M_h._M_buckets[uVar29 & 0xffffffff]->_M_nxt;
  uVar2 = *(uint *)&p_Var30[1]._M_nxt;
  while (uVar2 != 4) {
    p_Var30 = p_Var30->_M_nxt;
    if ((p_Var30 == (_Hash_node_base *)0x0) ||
       (uVar2 = *(uint *)&p_Var30[1]._M_nxt,
       (ulong)uVar2 % m.matrix_.matrix_._M_h._M_bucket_count != uVar29)) goto LAB_0011e818;
  }
  local_7d0._0_1_ = p_Var30[5]._M_nxt != p_Var30 + 5 && p_Var30[5]._M_nxt != (_Hash_node_base *)0x0;
  local_7c8 = 0;
  sStack_7c0.pi_ = (sp_counted_base *)0x0;
  local_7b0 = (undefined **)0x1b6bc2;
  local_7a8 = "";
  local_788 = 0;
  local_790 = &PTR__lazy_ostream_001f2250;
  local_780 = &boost::unit_test::lazy_ostream::inst;
  local_330 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_328 = "";
  local_778 = &local_7b0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_7c0);
  local_340 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_338 = "";
  local_350 = &boost::unit_test::basic_cstring<char_const>::null;
  local_348 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_340,0x1d1);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = m.matrix_.matrix_._M_h._M_bucket_count;
  uVar29 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(5)) % auVar13,0);
  if (m.matrix_.matrix_._M_h._M_buckets[uVar29 & 0xffffffff] == (__node_base_ptr)0x0)
  goto LAB_0011e824;
  p_Var30 = m.matrix_.matrix_._M_h._M_buckets[uVar29 & 0xffffffff]->_M_nxt;
  uVar2 = *(uint *)&p_Var30[1]._M_nxt;
  while (uVar2 != 5) {
    p_Var30 = p_Var30->_M_nxt;
    if ((p_Var30 == (_Hash_node_base *)0x0) ||
       (uVar2 = *(uint *)&p_Var30[1]._M_nxt,
       (ulong)uVar2 % m.matrix_.matrix_._M_h._M_bucket_count != uVar29)) {
LAB_0011e824:
      std::__throw_out_of_range("_Map_base::at");
    }
  }
  local_7d0._0_1_ = p_Var30[5]._M_nxt != p_Var30 + 5 && p_Var30[5]._M_nxt != (_Hash_node_base *)0x0;
  local_7c8 = 0;
  sStack_7c0.pi_ = (sp_counted_base *)0x0;
  local_7b0 = (undefined **)0x1b6bd7;
  local_7a8 = "";
  local_788 = 0;
  local_790 = &PTR__lazy_ostream_001f2250;
  local_780 = &boost::unit_test::lazy_ostream::inst;
  local_360 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_358 = "";
  local_778 = &local_7b0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_7c0);
  local_370 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_368 = "";
  local_380 = &boost::unit_test::basic_cstring<char_const>::null;
  local_378 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_370,0x1d3);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = m.matrix_.matrix_._M_h._M_bucket_count;
  uVar29 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(6)) % auVar14,0);
  if (m.matrix_.matrix_._M_h._M_buckets[uVar29 & 0xffffffff] == (__node_base_ptr)0x0) {
LAB_0011e830:
    std::__throw_out_of_range("_Map_base::at");
  }
  p_Var30 = m.matrix_.matrix_._M_h._M_buckets[uVar29 & 0xffffffff]->_M_nxt;
  uVar2 = *(uint *)&p_Var30[1]._M_nxt;
  while (uVar2 != 6) {
    p_Var30 = p_Var30->_M_nxt;
    if ((p_Var30 == (_Hash_node_base *)0x0) ||
       (uVar2 = *(uint *)&p_Var30[1]._M_nxt,
       (ulong)uVar2 % m.matrix_.matrix_._M_h._M_bucket_count != uVar29)) goto LAB_0011e830;
  }
  local_7d0 = (undefined **)
              CONCAT71(local_7d0._1_7_,
                       p_Var30[5]._M_nxt != p_Var30 + 5 &&
                       p_Var30[5]._M_nxt != (_Hash_node_base *)0x0);
  local_7c8 = 0;
  sStack_7c0.pi_ = (sp_counted_base *)0x0;
  local_7b0 = (undefined **)0x1b6bec;
  local_7a8 = "";
  local_788 = 0;
  local_790 = &PTR__lazy_ostream_001f2250;
  local_780 = &boost::unit_test::lazy_ostream::inst;
  local_390 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_388 = "";
  local_778 = &local_7b0;
  boost::test_tools::tt_detail::report_assertion(&local_7d0,&local_790,&local_390,0x1d3,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_7c0);
  local_3a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_398 = "";
  local_3b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_3a0,0x1d5);
  local_7a8 = (char *)((ulong)local_7a8 & 0xffffffffffffff00);
  local_7b0 = &PTR__lazy_ostream_001f2110;
  local_7a0 = &boost::unit_test::lazy_ostream::inst;
  local_798 = "";
  if (*m.matrix_.matrix_._M_h._M_buckets == (__node_base_ptr)0x0) goto LAB_0011e7ac;
  p_Var30 = (*m.matrix_.matrix_._M_h._M_buckets)->_M_nxt;
  uVar2 = *(uint *)&p_Var30[1]._M_nxt;
  while (uVar2 != 0) {
    p_Var30 = p_Var30->_M_nxt;
    if ((p_Var30 == (_Hash_node_base *)0x0) ||
       (uVar2 = *(uint *)&p_Var30[1]._M_nxt,
       (ulong)uVar2 % m.matrix_.matrix_._M_h._M_bucket_count != 0)) {
LAB_0011e7ac:
      std::__throw_out_of_range("_Map_base::at");
    }
  }
  local_7e4 = *(int *)&p_Var30[2]._M_nxt;
  local_7e8 = 0;
  local_770[0] = local_7e4 == 0;
  local_768 = 0;
  sStack_760.pi_ = (sp_counted_base *)0x0;
  local_758 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_750 = "";
  local_7d8 = (undefined **)&local_7e4;
  local_788 = 0;
  local_790 = &PTR__lazy_ostream_001f20d0;
  local_780 = &boost::unit_test::lazy_ostream::inst;
  local_778 = &local_7d8;
  local_7c8 = local_7c8 & 0xffffffffffffff00;
  local_7d0 = &PTR__lazy_ostream_001f20d0;
  sStack_7c0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_7b8 = &local_7e0;
  local_7e0 = (undefined1 *)&local_7e8;
  boost::test_tools::tt_detail::report_assertion
            (local_770,&local_7b0,&local_758,0x1d5,1,2,2,"m.get_column_dimension(0)",&local_790,"0",
             &local_7d0);
  boost::detail::shared_count::~shared_count(&sStack_760);
  local_3c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_3b8 = "";
  local_3d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_3c0,0x1d6);
  local_7a8 = (char *)((ulong)local_7a8 & 0xffffffffffffff00);
  local_7b0 = &PTR__lazy_ostream_001f2110;
  local_7a0 = &boost::unit_test::lazy_ostream::inst;
  local_798 = "";
  if (m.matrix_.matrix_._M_h._M_buckets[m.matrix_.matrix_._M_h._M_bucket_count != 1] ==
      (__node_base_ptr)0x0) {
LAB_0011e83c:
    std::__throw_out_of_range("_Map_base::at");
  }
  p_Var30 = m.matrix_.matrix_._M_h._M_buckets[m.matrix_.matrix_._M_h._M_bucket_count != 1]->_M_nxt;
  uVar2 = *(uint *)&p_Var30[1]._M_nxt;
  while (uVar2 != 1) {
    p_Var30 = p_Var30->_M_nxt;
    if ((p_Var30 == (_Hash_node_base *)0x0) ||
       (uVar2 = *(uint *)&p_Var30[1]._M_nxt,
       (uint)((ulong)uVar2 % m.matrix_.matrix_._M_h._M_bucket_count) !=
       (uint)(m.matrix_.matrix_._M_h._M_bucket_count != 1))) goto LAB_0011e83c;
  }
  local_7e4 = *(int *)&p_Var30[2]._M_nxt;
  local_7e8 = 0;
  local_770[0] = local_7e4 == 0;
  local_768 = 0;
  sStack_760.pi_ = (sp_counted_base *)0x0;
  local_758 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_750 = "";
  local_7d8 = (undefined **)&local_7e4;
  local_788 = 0;
  local_790 = &PTR__lazy_ostream_001f20d0;
  local_780 = &boost::unit_test::lazy_ostream::inst;
  local_778 = &local_7d8;
  local_7c8 = local_7c8 & 0xffffffffffffff00;
  local_7d0 = &PTR__lazy_ostream_001f20d0;
  sStack_7c0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_7b8 = &local_7e0;
  local_7e0 = (undefined1 *)&local_7e8;
  boost::test_tools::tt_detail::report_assertion
            (local_770,&local_7b0,&local_758,0x1d6,1,2,2,"m.get_column_dimension(1)",&local_790,"0",
             &local_7d0);
  boost::detail::shared_count::~shared_count(&sStack_760);
  local_3e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_3d8 = "";
  local_3f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_3e0,0x1d7);
  local_7a8 = (char *)((ulong)local_7a8 & 0xffffffffffffff00);
  local_7b0 = &PTR__lazy_ostream_001f2110;
  local_7a0 = &boost::unit_test::lazy_ostream::inst;
  local_798 = "";
  auVar15._8_8_ = 0;
  auVar15._0_8_ = m.matrix_.matrix_._M_h._M_bucket_count;
  uVar29 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(2)) % auVar15,0);
  if (m.matrix_.matrix_._M_h._M_buckets[uVar29 & 0xffffffff] == (__node_base_ptr)0x0)
  goto LAB_0011e848;
  p_Var30 = m.matrix_.matrix_._M_h._M_buckets[uVar29 & 0xffffffff]->_M_nxt;
  uVar2 = *(uint *)&p_Var30[1]._M_nxt;
  while (uVar2 != 2) {
    p_Var30 = p_Var30->_M_nxt;
    if ((p_Var30 == (_Hash_node_base *)0x0) ||
       (uVar2 = *(uint *)&p_Var30[1]._M_nxt,
       (ulong)uVar2 % m.matrix_.matrix_._M_h._M_bucket_count != uVar29)) {
LAB_0011e848:
      std::__throw_out_of_range("_Map_base::at");
    }
  }
  local_7e4 = *(int *)&p_Var30[2]._M_nxt;
  local_7e8 = 0;
  local_770[0] = local_7e4 == 0;
  local_768 = 0;
  sStack_760.pi_ = (sp_counted_base *)0x0;
  local_758 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_750 = "";
  local_7d8 = (undefined **)&local_7e4;
  local_788 = 0;
  local_790 = &PTR__lazy_ostream_001f20d0;
  local_780 = &boost::unit_test::lazy_ostream::inst;
  local_778 = &local_7d8;
  local_7c8 = local_7c8 & 0xffffffffffffff00;
  local_7d0 = &PTR__lazy_ostream_001f20d0;
  sStack_7c0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_7b8 = &local_7e0;
  local_7e0 = (undefined1 *)&local_7e8;
  boost::test_tools::tt_detail::report_assertion
            (local_770,&local_7b0,&local_758,0x1d7,1,2,2,"m.get_column_dimension(2)",&local_790,"0",
             &local_7d0);
  boost::detail::shared_count::~shared_count(&sStack_760);
  local_400 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_3f8 = "";
  local_410 = &boost::unit_test::basic_cstring<char_const>::null;
  local_408 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_400,0x1d8);
  local_7a8 = (char *)((ulong)local_7a8 & 0xffffffffffffff00);
  local_7b0 = &PTR__lazy_ostream_001f2110;
  local_7a0 = &boost::unit_test::lazy_ostream::inst;
  local_798 = "";
  auVar16._8_8_ = 0;
  auVar16._0_8_ = m.matrix_.matrix_._M_h._M_bucket_count;
  uVar29 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar16,0);
  if (m.matrix_.matrix_._M_h._M_buckets[uVar29 & 0xffffffff] == (__node_base_ptr)0x0) {
LAB_0011e854:
    std::__throw_out_of_range("_Map_base::at");
  }
  p_Var30 = m.matrix_.matrix_._M_h._M_buckets[uVar29 & 0xffffffff]->_M_nxt;
  uVar2 = *(uint *)&p_Var30[1]._M_nxt;
  while (uVar2 != 3) {
    p_Var30 = p_Var30->_M_nxt;
    if ((p_Var30 == (_Hash_node_base *)0x0) ||
       (uVar2 = *(uint *)&p_Var30[1]._M_nxt,
       (ulong)uVar2 % m.matrix_.matrix_._M_h._M_bucket_count != uVar29)) goto LAB_0011e854;
  }
  local_7e4 = *(int *)&p_Var30[2]._M_nxt;
  local_7e8 = 1;
  local_770[0] = local_7e4 == 1;
  local_768 = 0;
  sStack_760.pi_ = (sp_counted_base *)0x0;
  local_758 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_750 = "";
  local_7d8 = (undefined **)&local_7e4;
  local_788 = 0;
  local_790 = &PTR__lazy_ostream_001f20d0;
  local_780 = &boost::unit_test::lazy_ostream::inst;
  local_778 = &local_7d8;
  local_7c8 = local_7c8 & 0xffffffffffffff00;
  local_7d0 = &PTR__lazy_ostream_001f20d0;
  sStack_7c0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_7b8 = &local_7e0;
  local_7e0 = (undefined1 *)&local_7e8;
  boost::test_tools::tt_detail::report_assertion
            (local_770,&local_7b0,&local_758,0x1d8,1,2,2,"m.get_column_dimension(3)",&local_790,"1",
             &local_7d0);
  boost::detail::shared_count::~shared_count(&sStack_760);
  local_420 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_418 = "";
  local_430 = &boost::unit_test::basic_cstring<char_const>::null;
  local_428 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_420,0x1d9);
  local_7a8 = (char *)((ulong)local_7a8 & 0xffffffffffffff00);
  local_7b0 = &PTR__lazy_ostream_001f2110;
  local_7a0 = &boost::unit_test::lazy_ostream::inst;
  local_798 = "";
  auVar17._8_8_ = 0;
  auVar17._0_8_ = m.matrix_.matrix_._M_h._M_bucket_count;
  uVar29 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(4)) % auVar17,0);
  if (m.matrix_.matrix_._M_h._M_buckets[uVar29 & 0xffffffff] == (__node_base_ptr)0x0)
  goto LAB_0011e860;
  p_Var30 = m.matrix_.matrix_._M_h._M_buckets[uVar29 & 0xffffffff]->_M_nxt;
  uVar2 = *(uint *)&p_Var30[1]._M_nxt;
  while (uVar2 != 4) {
    p_Var30 = p_Var30->_M_nxt;
    if ((p_Var30 == (_Hash_node_base *)0x0) ||
       (uVar2 = *(uint *)&p_Var30[1]._M_nxt,
       (ulong)uVar2 % m.matrix_.matrix_._M_h._M_bucket_count != uVar29)) {
LAB_0011e860:
      std::__throw_out_of_range("_Map_base::at");
    }
  }
  local_7e4 = *(int *)&p_Var30[2]._M_nxt;
  local_7e8 = 1;
  local_770[0] = local_7e4 == 1;
  local_768 = 0;
  sStack_760.pi_ = (sp_counted_base *)0x0;
  local_758 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_750 = "";
  local_7d8 = (undefined **)&local_7e4;
  local_788 = 0;
  local_790 = &PTR__lazy_ostream_001f20d0;
  local_780 = &boost::unit_test::lazy_ostream::inst;
  local_778 = &local_7d8;
  local_7c8 = local_7c8 & 0xffffffffffffff00;
  local_7d0 = &PTR__lazy_ostream_001f20d0;
  sStack_7c0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_7b8 = &local_7e0;
  local_7e0 = (undefined1 *)&local_7e8;
  boost::test_tools::tt_detail::report_assertion
            (local_770,&local_7b0,&local_758,0x1d9,1,2,2,"m.get_column_dimension(4)",&local_790,"1",
             &local_7d0);
  boost::detail::shared_count::~shared_count(&sStack_760);
  local_440 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_438 = "";
  local_450 = &boost::unit_test::basic_cstring<char_const>::null;
  local_448 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_440,0x1da);
  local_7a8 = (char *)((ulong)local_7a8 & 0xffffffffffffff00);
  local_7b0 = &PTR__lazy_ostream_001f2110;
  local_7a0 = &boost::unit_test::lazy_ostream::inst;
  local_798 = "";
  auVar18._8_8_ = 0;
  auVar18._0_8_ = m.matrix_.matrix_._M_h._M_bucket_count;
  uVar29 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(5)) % auVar18,0);
  if (m.matrix_.matrix_._M_h._M_buckets[uVar29 & 0xffffffff] == (__node_base_ptr)0x0) {
LAB_0011e86c:
    std::__throw_out_of_range("_Map_base::at");
  }
  p_Var30 = m.matrix_.matrix_._M_h._M_buckets[uVar29 & 0xffffffff]->_M_nxt;
  uVar2 = *(uint *)&p_Var30[1]._M_nxt;
  while (uVar2 != 5) {
    p_Var30 = p_Var30->_M_nxt;
    if ((p_Var30 == (_Hash_node_base *)0x0) ||
       (uVar2 = *(uint *)&p_Var30[1]._M_nxt,
       (ulong)uVar2 % m.matrix_.matrix_._M_h._M_bucket_count != uVar29)) goto LAB_0011e86c;
  }
  local_7e4 = *(int *)&p_Var30[2]._M_nxt;
  local_7e8 = 1;
  local_770[0] = local_7e4 == 1;
  local_768 = 0;
  sStack_760.pi_ = (sp_counted_base *)0x0;
  local_758 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_750 = "";
  local_7d8 = (undefined **)&local_7e4;
  local_788 = 0;
  local_790 = &PTR__lazy_ostream_001f20d0;
  local_780 = &boost::unit_test::lazy_ostream::inst;
  local_778 = &local_7d8;
  local_7c8 = local_7c8 & 0xffffffffffffff00;
  local_7d0 = &PTR__lazy_ostream_001f20d0;
  sStack_7c0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_7b8 = &local_7e0;
  local_7e0 = (undefined1 *)&local_7e8;
  boost::test_tools::tt_detail::report_assertion
            (local_770,&local_7b0,&local_758,0x1da,1,2,2,"m.get_column_dimension(5)",&local_790,"1",
             &local_7d0);
  boost::detail::shared_count::~shared_count(&sStack_760);
  local_460 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_458 = "";
  local_470 = &boost::unit_test::basic_cstring<char_const>::null;
  local_468 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_460,0x1db);
  local_7a8 = (char *)((ulong)local_7a8 & 0xffffffffffffff00);
  local_7b0 = &PTR__lazy_ostream_001f2110;
  local_7a0 = &boost::unit_test::lazy_ostream::inst;
  local_798 = "";
  auVar19._8_8_ = 0;
  auVar19._0_8_ = m.matrix_.matrix_._M_h._M_bucket_count;
  uVar29 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(6)) % auVar19,0);
  if (m.matrix_.matrix_._M_h._M_buckets[uVar29 & 0xffffffff] == (__node_base_ptr)0x0)
  goto LAB_0011e878;
  p_Var30 = m.matrix_.matrix_._M_h._M_buckets[uVar29 & 0xffffffff]->_M_nxt;
  uVar2 = *(uint *)&p_Var30[1]._M_nxt;
  while (uVar2 != 6) {
    p_Var30 = p_Var30->_M_nxt;
    if ((p_Var30 == (_Hash_node_base *)0x0) ||
       (uVar2 = *(uint *)&p_Var30[1]._M_nxt,
       (ulong)uVar2 % m.matrix_.matrix_._M_h._M_bucket_count != uVar29)) {
LAB_0011e878:
      std::__throw_out_of_range("_Map_base::at");
    }
  }
  local_7e4 = *(int *)&p_Var30[2]._M_nxt;
  local_7e8 = 2;
  local_770[0] = local_7e4 == 2;
  local_768 = 0;
  sStack_760.pi_ = (sp_counted_base *)0x0;
  local_758 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_750 = "";
  local_7d8 = (undefined **)&local_7e4;
  local_788 = 0;
  local_790 = &PTR__lazy_ostream_001f20d0;
  local_780 = &boost::unit_test::lazy_ostream::inst;
  local_778 = &local_7d8;
  local_7c8 = local_7c8 & 0xffffffffffffff00;
  local_7d0 = &PTR__lazy_ostream_001f20d0;
  sStack_7c0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_7b8 = &local_7e0;
  local_7e0 = (undefined1 *)&local_7e8;
  boost::test_tools::tt_detail::report_assertion
            (local_770,&local_7b0,&local_758,0x1db,1,2,2,"m.get_column_dimension(6)",&local_790,"2",
             &local_7d0);
  boost::detail::shared_count::~shared_count(&sStack_760);
  local_480 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_478 = "";
  local_490 = &boost::unit_test::basic_cstring<char_const>::null;
  local_488 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_480,0x1dd);
  local_7a8 = (char *)((ulong)local_7a8 & 0xffffffffffffff00);
  local_7b0 = &PTR__lazy_ostream_001f2110;
  local_7a0 = &boost::unit_test::lazy_ostream::inst;
  local_798 = "";
  if (m.matrix_.
      super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<true,_(Column_types)7,_true,_true,_true>_>_>_>
      .rowSwapped_ == true) {
    Gudhi::persistence_matrix::
    Base_swap<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>,_Gudhi::persistence_matrix::Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>
    ::_orderRows(&m.matrix_.
                  super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<true,_(Column_types)7,_true,_true,_true>_>_>_>
                );
  }
  if (*m.matrix_.matrix_._M_h._M_buckets == (__node_base_ptr)0x0) {
LAB_0011e7b8:
    std::__throw_out_of_range("_Map_base::at");
  }
  p_Var30 = (*m.matrix_.matrix_._M_h._M_buckets)->_M_nxt;
  uVar2 = *(uint *)&p_Var30[1]._M_nxt;
  while (uVar2 != 0) {
    p_Var30 = p_Var30->_M_nxt;
    if ((p_Var30 == (_Hash_node_base *)0x0) ||
       (uVar2 = *(uint *)&p_Var30[1]._M_nxt,
       (ulong)uVar2 % m.matrix_.matrix_._M_h._M_bucket_count != 0)) goto LAB_0011e7b8;
  }
  iVar26 = -1;
  if (p_Var30[5]._M_nxt != p_Var30 + 5 && p_Var30[5]._M_nxt != (_Hash_node_base *)0x0) {
    if (p_Var30[6]._M_nxt == (_Hash_node_base *)0x0) goto LAB_0011e8d2;
    iVar26 = *(int *)&p_Var30[6]._M_nxt[2]._M_nxt;
  }
  local_7e8 = 0xffffffff;
  local_770[0] = iVar26 == -1;
  local_768 = 0;
  sStack_760.pi_ = (sp_counted_base *)0x0;
  local_758 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_750 = "";
  local_7d8 = (undefined **)&local_7e4;
  local_788 = 0;
  local_790 = &PTR__lazy_ostream_001f2080;
  local_780 = &boost::unit_test::lazy_ostream::inst;
  local_778 = &local_7d8;
  local_7c8 = local_7c8 & 0xffffffffffffff00;
  local_7d0 = &PTR__lazy_ostream_001f2080;
  sStack_7c0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_7b8 = &local_7e0;
  local_7e4 = iVar26;
  local_7e0 = (undefined1 *)&local_7e8;
  boost::test_tools::tt_detail::report_assertion
            (local_770,&local_7b0,&local_758,0x1dd,1,2,2,"m.get_pivot(0)",&local_790,
             "Matrix::template get_null_value<typename Matrix::ID_index>()",&local_7d0);
  boost::detail::shared_count::~shared_count(&sStack_760);
  local_4a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_498 = "";
  local_4b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_4a0,0x1de);
  local_7a8 = (char *)((ulong)local_7a8 & 0xffffffffffffff00);
  local_7b0 = &PTR__lazy_ostream_001f2110;
  local_7a0 = &boost::unit_test::lazy_ostream::inst;
  local_798 = "";
  if (m.matrix_.
      super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<true,_(Column_types)7,_true,_true,_true>_>_>_>
      .rowSwapped_ == true) {
    Gudhi::persistence_matrix::
    Base_swap<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>,_Gudhi::persistence_matrix::Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>
    ::_orderRows(&m.matrix_.
                  super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<true,_(Column_types)7,_true,_true,_true>_>_>_>
                );
  }
  if (m.matrix_.matrix_._M_h._M_buckets[m.matrix_.matrix_._M_h._M_bucket_count != 1] ==
      (__node_base_ptr)0x0) goto LAB_0011e884;
  p_Var30 = m.matrix_.matrix_._M_h._M_buckets[m.matrix_.matrix_._M_h._M_bucket_count != 1]->_M_nxt;
  uVar2 = *(uint *)&p_Var30[1]._M_nxt;
  while (uVar2 != 1) {
    p_Var30 = p_Var30->_M_nxt;
    if ((p_Var30 == (_Hash_node_base *)0x0) ||
       (uVar2 = *(uint *)&p_Var30[1]._M_nxt,
       (uint)((ulong)uVar2 % m.matrix_.matrix_._M_h._M_bucket_count) !=
       (uint)(m.matrix_.matrix_._M_h._M_bucket_count != 1))) {
LAB_0011e884:
      std::__throw_out_of_range("_Map_base::at");
    }
  }
  iVar26 = -1;
  if (p_Var30[5]._M_nxt != p_Var30 + 5 && p_Var30[5]._M_nxt != (_Hash_node_base *)0x0) {
    if (p_Var30[6]._M_nxt == (_Hash_node_base *)0x0) goto LAB_0011e8d2;
    iVar26 = *(int *)&p_Var30[6]._M_nxt[2]._M_nxt;
  }
  local_7e8 = 0xffffffff;
  local_770[0] = iVar26 == -1;
  local_768 = 0;
  sStack_760.pi_ = (sp_counted_base *)0x0;
  local_758 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_750 = "";
  local_7d8 = (undefined **)&local_7e4;
  local_788 = 0;
  local_790 = &PTR__lazy_ostream_001f2080;
  local_780 = &boost::unit_test::lazy_ostream::inst;
  local_778 = &local_7d8;
  local_7c8 = local_7c8 & 0xffffffffffffff00;
  local_7d0 = &PTR__lazy_ostream_001f2080;
  sStack_7c0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_7b8 = &local_7e0;
  local_7e4 = iVar26;
  local_7e0 = (undefined1 *)&local_7e8;
  boost::test_tools::tt_detail::report_assertion
            (local_770,&local_7b0,&local_758,0x1de,1,2,2,"m.get_pivot(1)",&local_790,
             "Matrix::template get_null_value<typename Matrix::ID_index>()",&local_7d0);
  boost::detail::shared_count::~shared_count(&sStack_760);
  local_4c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_4b8 = "";
  local_4d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_4c0,0x1df);
  local_7a8 = (char *)((ulong)local_7a8 & 0xffffffffffffff00);
  local_7b0 = &PTR__lazy_ostream_001f2110;
  local_7a0 = &boost::unit_test::lazy_ostream::inst;
  local_798 = "";
  if (m.matrix_.
      super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<true,_(Column_types)7,_true,_true,_true>_>_>_>
      .rowSwapped_ == true) {
    Gudhi::persistence_matrix::
    Base_swap<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>,_Gudhi::persistence_matrix::Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>
    ::_orderRows(&m.matrix_.
                  super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<true,_(Column_types)7,_true,_true,_true>_>_>_>
                );
  }
  auVar20._8_8_ = 0;
  auVar20._0_8_ = m.matrix_.matrix_._M_h._M_bucket_count;
  uVar29 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(2)) % auVar20,0);
  if (m.matrix_.matrix_._M_h._M_buckets[uVar29 & 0xffffffff] == (__node_base_ptr)0x0) {
LAB_0011e890:
    std::__throw_out_of_range("_Map_base::at");
  }
  p_Var30 = m.matrix_.matrix_._M_h._M_buckets[uVar29 & 0xffffffff]->_M_nxt;
  uVar2 = *(uint *)&p_Var30[1]._M_nxt;
  while (uVar2 != 2) {
    p_Var30 = p_Var30->_M_nxt;
    if ((p_Var30 == (_Hash_node_base *)0x0) ||
       (uVar2 = *(uint *)&p_Var30[1]._M_nxt,
       (ulong)uVar2 % m.matrix_.matrix_._M_h._M_bucket_count != uVar29)) goto LAB_0011e890;
  }
  iVar26 = -1;
  if (p_Var30[5]._M_nxt != p_Var30 + 5 && p_Var30[5]._M_nxt != (_Hash_node_base *)0x0) {
    if (p_Var30[6]._M_nxt == (_Hash_node_base *)0x0) goto LAB_0011e8d2;
    iVar26 = *(int *)&p_Var30[6]._M_nxt[2]._M_nxt;
  }
  local_7e8 = 0xffffffff;
  local_770[0] = iVar26 == -1;
  local_768 = 0;
  sStack_760.pi_ = (sp_counted_base *)0x0;
  local_758 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_750 = "";
  local_7d8 = (undefined **)&local_7e4;
  local_788 = 0;
  local_790 = &PTR__lazy_ostream_001f2080;
  local_780 = &boost::unit_test::lazy_ostream::inst;
  local_778 = &local_7d8;
  local_7c8 = local_7c8 & 0xffffffffffffff00;
  local_7d0 = &PTR__lazy_ostream_001f2080;
  sStack_7c0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_7b8 = &local_7e0;
  local_7e4 = iVar26;
  local_7e0 = (undefined1 *)&local_7e8;
  boost::test_tools::tt_detail::report_assertion
            (local_770,&local_7b0,&local_758,0x1df,1,2,2,"m.get_pivot(2)",&local_790,
             "Matrix::template get_null_value<typename Matrix::ID_index>()",&local_7d0);
  boost::detail::shared_count::~shared_count(&sStack_760);
  local_4e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_4d8 = "";
  local_4f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_4e0,0x1e0);
  local_7a8 = (char *)((ulong)local_7a8 & 0xffffffffffffff00);
  local_7b0 = &PTR__lazy_ostream_001f2110;
  local_7a0 = &boost::unit_test::lazy_ostream::inst;
  local_798 = "";
  if (m.matrix_.
      super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<true,_(Column_types)7,_true,_true,_true>_>_>_>
      .rowSwapped_ == true) {
    Gudhi::persistence_matrix::
    Base_swap<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>,_Gudhi::persistence_matrix::Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>
    ::_orderRows(&m.matrix_.
                  super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<true,_(Column_types)7,_true,_true,_true>_>_>_>
                );
  }
  auVar21._8_8_ = 0;
  auVar21._0_8_ = m.matrix_.matrix_._M_h._M_bucket_count;
  uVar29 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar21,0);
  if (m.matrix_.matrix_._M_h._M_buckets[uVar29 & 0xffffffff] == (__node_base_ptr)0x0)
  goto LAB_0011e89c;
  p_Var30 = m.matrix_.matrix_._M_h._M_buckets[uVar29 & 0xffffffff]->_M_nxt;
  uVar2 = *(uint *)&p_Var30[1]._M_nxt;
  while (uVar2 != 3) {
    p_Var30 = p_Var30->_M_nxt;
    if ((p_Var30 == (_Hash_node_base *)0x0) ||
       (uVar2 = *(uint *)&p_Var30[1]._M_nxt,
       (ulong)uVar2 % m.matrix_.matrix_._M_h._M_bucket_count != uVar29)) {
LAB_0011e89c:
      std::__throw_out_of_range("_Map_base::at");
    }
  }
  iVar26 = -1;
  if (p_Var30[5]._M_nxt != p_Var30 + 5 && p_Var30[5]._M_nxt != (_Hash_node_base *)0x0) {
    if (p_Var30[6]._M_nxt == (_Hash_node_base *)0x0) goto LAB_0011e8d2;
    iVar26 = *(int *)&p_Var30[6]._M_nxt[2]._M_nxt;
  }
  local_7e8 = 1;
  local_770[0] = iVar26 == 1;
  local_768 = 0;
  sStack_760.pi_ = (sp_counted_base *)0x0;
  local_758 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_750 = "";
  local_7d8 = (undefined **)&local_7e4;
  local_788 = 0;
  local_790 = &PTR__lazy_ostream_001f2080;
  local_780 = &boost::unit_test::lazy_ostream::inst;
  local_778 = &local_7d8;
  local_7c8 = local_7c8 & 0xffffffffffffff00;
  local_7d0 = &PTR__lazy_ostream_001f20d0;
  sStack_7c0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_7b8 = &local_7e0;
  local_7e4 = iVar26;
  local_7e0 = (undefined1 *)&local_7e8;
  boost::test_tools::tt_detail::report_assertion
            (local_770,&local_7b0,&local_758,0x1e0,1,2,2,"m.get_pivot(3)",&local_790,"1",&local_7d0)
  ;
  boost::detail::shared_count::~shared_count(&sStack_760);
  local_500 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_4f8 = "";
  local_510 = &boost::unit_test::basic_cstring<char_const>::null;
  local_508 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_500,0x1e1);
  local_7a8 = (char *)((ulong)local_7a8 & 0xffffffffffffff00);
  local_7b0 = &PTR__lazy_ostream_001f2110;
  local_7a0 = &boost::unit_test::lazy_ostream::inst;
  local_798 = "";
  if (m.matrix_.
      super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<true,_(Column_types)7,_true,_true,_true>_>_>_>
      .rowSwapped_ == true) {
    Gudhi::persistence_matrix::
    Base_swap<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>,_Gudhi::persistence_matrix::Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>
    ::_orderRows(&m.matrix_.
                  super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<true,_(Column_types)7,_true,_true,_true>_>_>_>
                );
  }
  auVar22._8_8_ = 0;
  auVar22._0_8_ = m.matrix_.matrix_._M_h._M_bucket_count;
  uVar29 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(4)) % auVar22,0);
  if (m.matrix_.matrix_._M_h._M_buckets[uVar29 & 0xffffffff] == (__node_base_ptr)0x0) {
LAB_0011e8a8:
    std::__throw_out_of_range("_Map_base::at");
  }
  p_Var30 = m.matrix_.matrix_._M_h._M_buckets[uVar29 & 0xffffffff]->_M_nxt;
  uVar2 = *(uint *)&p_Var30[1]._M_nxt;
  while (uVar2 != 4) {
    p_Var30 = p_Var30->_M_nxt;
    if ((p_Var30 == (_Hash_node_base *)0x0) ||
       (uVar2 = *(uint *)&p_Var30[1]._M_nxt,
       (ulong)uVar2 % m.matrix_.matrix_._M_h._M_bucket_count != uVar29)) goto LAB_0011e8a8;
  }
  iVar26 = -1;
  if (p_Var30[5]._M_nxt != p_Var30 + 5 && p_Var30[5]._M_nxt != (_Hash_node_base *)0x0) {
    if (p_Var30[6]._M_nxt == (_Hash_node_base *)0x0) goto LAB_0011e8d2;
    iVar26 = *(int *)&p_Var30[6]._M_nxt[2]._M_nxt;
  }
  local_7e8 = 2;
  local_770[0] = iVar26 == 2;
  local_768 = 0;
  sStack_760.pi_ = (sp_counted_base *)0x0;
  local_758 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_750 = "";
  local_7d8 = (undefined **)&local_7e4;
  local_788 = 0;
  local_790 = &PTR__lazy_ostream_001f2080;
  local_780 = &boost::unit_test::lazy_ostream::inst;
  local_778 = &local_7d8;
  local_7c8 = local_7c8 & 0xffffffffffffff00;
  local_7d0 = &PTR__lazy_ostream_001f20d0;
  sStack_7c0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_7b8 = &local_7e0;
  local_7e4 = iVar26;
  local_7e0 = (undefined1 *)&local_7e8;
  boost::test_tools::tt_detail::report_assertion
            (local_770,&local_7b0,&local_758,0x1e1,1,2,2,"m.get_pivot(4)",&local_790,"2",&local_7d0)
  ;
  boost::detail::shared_count::~shared_count(&sStack_760);
  local_520 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_518 = "";
  local_530 = &boost::unit_test::basic_cstring<char_const>::null;
  local_528 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_520,0x1e5);
  local_7a8 = (char *)((ulong)local_7a8 & 0xffffffffffffff00);
  local_7b0 = &PTR__lazy_ostream_001f2110;
  local_7a0 = &boost::unit_test::lazy_ostream::inst;
  local_798 = "";
  if (m.matrix_.
      super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<true,_(Column_types)7,_true,_true,_true>_>_>_>
      .rowSwapped_ == true) {
    Gudhi::persistence_matrix::
    Base_swap<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>,_Gudhi::persistence_matrix::Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>
    ::_orderRows(&m.matrix_.
                  super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<true,_(Column_types)7,_true,_true,_true>_>_>_>
                );
  }
  auVar23._8_8_ = 0;
  auVar23._0_8_ = m.matrix_.matrix_._M_h._M_bucket_count;
  uVar29 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(5)) % auVar23,0);
  if (m.matrix_.matrix_._M_h._M_buckets[uVar29 & 0xffffffff] == (__node_base_ptr)0x0)
  goto LAB_0011e8b4;
  p_Var30 = m.matrix_.matrix_._M_h._M_buckets[uVar29 & 0xffffffff]->_M_nxt;
  uVar2 = *(uint *)&p_Var30[1]._M_nxt;
  while (uVar2 != 5) {
    p_Var30 = p_Var30->_M_nxt;
    if ((p_Var30 == (_Hash_node_base *)0x0) ||
       (uVar2 = *(uint *)&p_Var30[1]._M_nxt,
       (ulong)uVar2 % m.matrix_.matrix_._M_h._M_bucket_count != uVar29)) {
LAB_0011e8b4:
      std::__throw_out_of_range("_Map_base::at");
    }
  }
  iVar26 = -1;
  if (p_Var30[5]._M_nxt != p_Var30 + 5 && p_Var30[5]._M_nxt != (_Hash_node_base *)0x0) {
    if (p_Var30[6]._M_nxt == (_Hash_node_base *)0x0) {
LAB_0011e8d2:
      __assert_fail("!!p","/usr/include/boost/intrusive/detail/hook_traits.hpp",0x3e,
                    "static pointer boost::intrusive::bhtraits_base<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options<true, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, true, true>>>, boost::intrusive::list_node<void *> *, Gudhi::persistence_matrix::Matrix<Boundary_options<true, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, true, true>>::Matrix_column_tag, 1>::to_value_ptr(const node_ptr &) [T = Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options<true, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, true, true>>>, NodePtr = boost::intrusive::list_node<void *> *, Tag = Gudhi::persistence_matrix::Matrix<Boundary_options<true, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, true, true>>::Matrix_column_tag, Type = 1]"
                   );
    }
    iVar26 = *(int *)&p_Var30[6]._M_nxt[2]._M_nxt;
  }
  local_7e8 = 2;
  local_770[0] = iVar26 == 2;
  local_768 = 0;
  sStack_760.pi_ = (sp_counted_base *)0x0;
  local_758 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_750 = "";
  local_7d8 = (undefined **)&local_7e4;
  local_788 = 0;
  local_790 = &PTR__lazy_ostream_001f2080;
  local_780 = &boost::unit_test::lazy_ostream::inst;
  local_778 = &local_7d8;
  local_7c8 = local_7c8 & 0xffffffffffffff00;
  local_7d0 = &PTR__lazy_ostream_001f20d0;
  sStack_7c0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_7b8 = &local_7e0;
  local_7e4 = iVar26;
  local_7e0 = (undefined1 *)&local_7e8;
  boost::test_tools::tt_detail::report_assertion
            (local_770,&local_7b0,&local_758,0x1e5,1,2,2,"m.get_pivot(5)",&local_790,"2",&local_7d0)
  ;
  boost::detail::shared_count::~shared_count(&sStack_760);
  local_540 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_538 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_540,0x1e7);
  local_7a8 = (char *)((ulong)local_7a8 & 0xffffffffffffff00);
  local_7b0 = &PTR__lazy_ostream_001f2110;
  local_7a0 = &boost::unit_test::lazy_ostream::inst;
  local_798 = "";
  if (m.matrix_.
      super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<true,_(Column_types)7,_true,_true,_true>_>_>_>
      .rowSwapped_ == true) {
    Gudhi::persistence_matrix::
    Base_swap<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>,_Gudhi::persistence_matrix::Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>
    ::_orderRows(&m.matrix_.
                  super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<true,_(Column_types)7,_true,_true,_true>_>_>_>
                );
  }
  auVar24._8_8_ = 0;
  auVar24._0_8_ = m.matrix_.matrix_._M_h._M_bucket_count;
  uVar29 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(6)) % auVar24,0);
  if (m.matrix_.matrix_._M_h._M_buckets[uVar29 & 0xffffffff] != (__node_base_ptr)0x0) {
    p_Var30 = m.matrix_.matrix_._M_h._M_buckets[uVar29 & 0xffffffff]->_M_nxt;
    uVar2 = *(uint *)&p_Var30[1]._M_nxt;
    do {
      if (uVar2 == 6) {
        iVar26 = -1;
        if (p_Var30[5]._M_nxt != p_Var30 + 5 && p_Var30[5]._M_nxt != (_Hash_node_base *)0x0) {
          if (p_Var30[6]._M_nxt == (_Hash_node_base *)0x0) goto LAB_0011e8d2;
          iVar26 = *(int *)&p_Var30[6]._M_nxt[2]._M_nxt;
        }
        local_7e8 = 5;
        local_770[0] = iVar26 == 5;
        local_768 = 0;
        sStack_760.pi_ = (sp_counted_base *)0x0;
        local_758 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
        ;
        local_750 = "";
        local_7d8 = (undefined **)&local_7e4;
        local_788 = 0;
        local_790 = &PTR__lazy_ostream_001f2080;
        local_780 = &boost::unit_test::lazy_ostream::inst;
        local_778 = &local_7d8;
        local_7c8 = local_7c8 & 0xffffffffffffff00;
        local_7d0 = &PTR__lazy_ostream_001f20d0;
        sStack_7c0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
        local_7b8 = &local_7e0;
        local_7e4 = iVar26;
        local_7e0 = (undefined1 *)&local_7e8;
        boost::test_tools::tt_detail::report_assertion
                  (local_770,&local_7b0,&local_758,0x1e7,1,2,2,"m.get_pivot(6)",&local_790,"5",
                   &local_7d0);
        boost::detail::shared_count::~shared_count(&sStack_760);
        Gudhi::persistence_matrix::
        Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>
        ::~Matrix(&m);
        if (boundary1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(boundary1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)boundary1.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)boundary1.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (boundary2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(boundary2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)boundary2.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)boundary2.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        std::
        vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ::~vector(&orderedBoundaries);
        return;
      }
      p_Var30 = p_Var30->_M_nxt;
    } while ((p_Var30 != (_Hash_node_base *)0x0) &&
            (uVar2 = *(uint *)&p_Var30[1]._M_nxt,
            (ulong)uVar2 % m.matrix_.matrix_._M_h._M_bucket_count == uVar29));
  }
  std::__throw_out_of_range("_Map_base::at");
  while ((p_Var4 = p_Var4->_M_nxt, p_Var4 != (_Hash_node_base *)0x0 &&
         (uVar2 = *(uint *)&p_Var4[1]._M_nxt,
         (ulong)uVar2 %
         m.matrix_.
         super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<true,_(Column_types)7,_true,_true,_true>_>_>_>
         .indexToRow_._M_h._M_bucket_count == 0))) {
joined_r0x0011c7e3:
    if (uVar2 == 0) {
      p_Var30 = p_Var30 + 5;
      p_Var27 = p_Var30;
      goto LAB_0011c81b;
    }
  }
LAB_0011e788:
  std::__throw_out_of_range("_Map_base::at");
  while ((p_Var4 = p_Var4->_M_nxt, p_Var4 != (_Hash_node_base *)0x0 &&
         (uVar2 = *(uint *)&p_Var4[1]._M_nxt,
         (ulong)uVar2 %
         m.matrix_.
         super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<true,_(Column_types)7,_true,_true,_true>_>_>_>
         .indexToRow_._M_h._M_bucket_count == 0))) {
joined_r0x0011ba15:
    if (uVar2 == 0) {
      p_Var30 = p_Var30 + 5;
      p_Var27 = p_Var30;
      goto LAB_0011ba4d;
    }
  }
LAB_0011e770:
  std::__throw_out_of_range("_Map_base::at");
  while ((p_Var4 = p_Var4->_M_nxt, p_Var4 != (_Hash_node_base *)0x0 &&
         (uVar2 = *(uint *)&p_Var4[1]._M_nxt,
         (ulong)uVar2 %
         m.matrix_.
         super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<true,_(Column_types)7,_true,_true,_true>_>_>_>
         .indexToRow_._M_h._M_bucket_count == 0))) {
joined_r0x0011b88f:
    if (uVar2 == 0) {
      p_Var30 = p_Var30 + 5;
      p_Var27 = p_Var30;
      goto LAB_0011b8c7;
    }
  }
LAB_0011e764:
  std::__throw_out_of_range("_Map_base::at");
}

Assistant:

void test_boundary_insertion() {
  auto orderedBoundaries = build_simple_boundary_matrix<typename Matrix::Column>();
  auto boundary2 = orderedBoundaries.back();
  orderedBoundaries.pop_back();
  auto boundary1 = orderedBoundaries.back();
  orderedBoundaries.pop_back();

  Matrix m(orderedBoundaries, 5);
  BOOST_CHECK(m.is_zero_entry(1, 0));
  BOOST_CHECK(!m.is_zero_entry(3, 0));
  BOOST_CHECK(m.is_zero_column(0));
  BOOST_CHECK(m.is_zero_column(1));
  BOOST_CHECK(m.is_zero_column(2));
  BOOST_CHECK(!m.is_zero_column(3));
  BOOST_CHECK(!m.is_zero_column(4));

  BOOST_CHECK_EQUAL(m.get_number_of_columns(), 5);
  m.insert_boundary(boundary1);
  BOOST_CHECK_EQUAL(m.get_number_of_columns(), 6);
  m.insert_boundary(boundary2);
  BOOST_CHECK_EQUAL(m.get_number_of_columns(), 7);
  BOOST_CHECK(m.is_zero_entry(1, 0));
  BOOST_CHECK(!m.is_zero_entry(3, 0));
  BOOST_CHECK(m.is_zero_column(0));
  BOOST_CHECK(m.is_zero_column(1));
  BOOST_CHECK(m.is_zero_column(2));
  BOOST_CHECK(!m.is_zero_column(3));
  BOOST_CHECK(!m.is_zero_column(4));
  if constexpr (is_RU<Matrix>()) {
    BOOST_CHECK(m.is_zero_column(5));  // was reduced
  } else {
    BOOST_CHECK(!m.is_zero_column(5));  // not reduced
  }
  BOOST_CHECK(!m.is_zero_column(6));

  BOOST_CHECK_EQUAL(m.get_column_dimension(0), 0);
  BOOST_CHECK_EQUAL(m.get_column_dimension(1), 0);
  BOOST_CHECK_EQUAL(m.get_column_dimension(2), 0);
  BOOST_CHECK_EQUAL(m.get_column_dimension(3), 1);
  BOOST_CHECK_EQUAL(m.get_column_dimension(4), 1);
  BOOST_CHECK_EQUAL(m.get_column_dimension(5), 1);
  BOOST_CHECK_EQUAL(m.get_column_dimension(6), 2);

  BOOST_CHECK_EQUAL(m.get_pivot(0), Matrix::template get_null_value<typename Matrix::ID_index>());
  BOOST_CHECK_EQUAL(m.get_pivot(1), Matrix::template get_null_value<typename Matrix::ID_index>());
  BOOST_CHECK_EQUAL(m.get_pivot(2), Matrix::template get_null_value<typename Matrix::ID_index>());
  BOOST_CHECK_EQUAL(m.get_pivot(3), 1);
  BOOST_CHECK_EQUAL(m.get_pivot(4), 2);
  if constexpr (is_RU<Matrix>()) {
    BOOST_CHECK_EQUAL(m.get_pivot(5), Matrix::template get_null_value<typename Matrix::ID_index>());  // was reduced
  } else {
    BOOST_CHECK_EQUAL(m.get_pivot(5), 2);  // not reduced
  }
  BOOST_CHECK_EQUAL(m.get_pivot(6), 5);

  if constexpr (is_RU<Matrix>()) {
    BOOST_CHECK_EQUAL(m.get_column_with_pivot(1), 3);
    BOOST_CHECK_EQUAL(m.get_column_with_pivot(2), 4);
    BOOST_CHECK_EQUAL(m.get_column_with_pivot(5), 6);
  }
}